

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastaTest_ParseAndReset_Test::~BioparserFastaTest_ParseAndReset_Test
          (BioparserFastaTest_ParseAndReset_Test *this)

{
  BioparserFastaTest_ParseAndReset_Test *this_local;
  
  ~BioparserFastaTest_ParseAndReset_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, ParseAndReset) {
  Setup("sample.fasta");
  s = p->Parse(-1);
  p->Reset();
  s.clear();
  for (auto t = p->Parse(65536); !t.empty(); t = p->Parse(65536)) {
    s.insert(
        s.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}